

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdso_support.cc
# Opt level: O2

void * __thiscall
absl::lts_20250127::debugging_internal::VDSOSupport::SetBase(VDSOSupport *this,void *base)

{
  undefined *puVar1;
  
  puVar1 = vdso_base_;
  if ((undefined4 *)base != &ElfMemImage::kInvalidBaseSentinel) {
    vdso_base_ = (undefined *)base;
    ElfMemImage::Init(&this->image_,base);
    getcpu_fn_ = InitAndGetCPU;
    return puVar1;
  }
  raw_log_internal::RawLog
            (kFatal,"vdso_support.cc",0x93,"Check %s failed: %s",
             "base != debugging_internal::ElfMemImage::kInvalidBase","internal error");
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/debugging/internal/vdso_support.cc"
                ,0x93,"const void *absl::debugging_internal::VDSOSupport::SetBase(const void *)");
}

Assistant:

const void *VDSOSupport::SetBase(const void *base) {
  ABSL_RAW_CHECK(base != debugging_internal::ElfMemImage::kInvalidBase,
                 "internal error");
  const void *old_base = vdso_base_.load(std::memory_order_relaxed);
  vdso_base_.store(base, std::memory_order_relaxed);
  image_.Init(base);
  // Also reset getcpu_fn_, so GetCPU could be tested with simulated VDSO.
  getcpu_fn_.store(&InitAndGetCPU, std::memory_order_relaxed);
  return old_base;
}